

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O0

SquareMatrix<float> __thiscall
qclab::dense::kron<float>(dense *this,SquareMatrix<float> *A,SquareMatrix<float> *B)

{
  int64_t iVar1;
  int64_t iVar2;
  data_type extraout_RDX;
  SquareMatrix<float> SVar3;
  SquareMatrix<float> *B_local;
  SquareMatrix<float> *A_local;
  SquareMatrix<float> *kronAB;
  
  iVar1 = SquareMatrix<float>::rows(A);
  iVar2 = SquareMatrix<float>::rows(B);
  SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,iVar1 * iVar2);
  kron<qclab::dense::SquareMatrix<float>>(A,B,(SquareMatrix<float> *)this);
  SVar3.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

SquareMatrix< T > kron( const SquareMatrix< T >& A ,
                            const SquareMatrix< T >& B ) {
      SquareMatrix< T > kronAB( A.rows() * B.rows() ) ;
      kron( A , B , kronAB ) ;
      return kronAB ;
    }